

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMS_AUTH_RESPONSE_Unmarshal(TPMS_AUTH_RESPONSE *target,BYTE **buffer,INT32 *size)

{
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMS_AUTH_RESPONSE *target_local;
  
  target_local._4_4_ = TPM2B_DIGEST_Unmarshal(&target->nonce,buffer,size);
  if ((target_local._4_4_ == 0) &&
     (target_local._4_4_ = TPMA_SESSION_Unmarshal(&target->sessionAttributes,buffer,size),
     target_local._4_4_ == 0)) {
    target_local._4_4_ = TPM2B_DIGEST_Unmarshal(&target->hmac,buffer,size);
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMS_AUTH_RESPONSE_Unmarshal(TPMS_AUTH_RESPONSE *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM2B_NONCE_Unmarshal((TPM2B_NONCE *)&(target->nonce), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMA_SESSION_Unmarshal((TPMA_SESSION *)&(target->sessionAttributes), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_AUTH_Unmarshal((TPM2B_AUTH *)&(target->hmac), buffer, size);
    return result;
}